

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall QList<QPoint>::resize(QList<QPoint> *this,qsizetype size)

{
  Data *pDVar1;
  long lVar2;
  
  pDVar1 = (this->d).d;
  if (((pDVar1 == (Data *)0x0) ||
      (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar1->super_QArrayData).alloc -
      ((long)((long)(this->d).ptr -
             ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) <
      size)) {
    QArrayDataPointer<QPoint>::detachAndGrow
              (&this->d,GrowsAtEnd,size - (this->d).size,(QPoint **)0x0,
               (QArrayDataPointer<QPoint> *)0x0);
  }
  else if (size < (this->d).size) {
    (this->d).size = size;
  }
  lVar2 = (this->d).size;
  if (size - lVar2 != 0 && lVar2 <= size) {
    memset((this->d).ptr + lVar2,0,(size - lVar2) * 8);
    (this->d).size = size;
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }